

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  FILE *__stream_00;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int local_68;
  
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "wrjpgcom";
  }
  iVar12 = 1;
  bVar1 = 1 < argc;
  if ((argc < 2) || (pcVar9 = argv[1], *pcVar9 != '-')) {
    pcVar8 = (char *)0x0;
    __stream = (FILE *)0x0;
    iVar11 = 0;
    local_68._0_1_ = false;
  }
  else {
    bVar2 = true;
    pcVar8 = (char *)0x0;
    __stream = (FILE *)0x0;
    sVar5 = 0;
    do {
      iVar11 = (int)sVar5;
      pcVar9 = pcVar9 + 1;
      iVar3 = keymatch(pcVar9,"replace",1);
      if (iVar3 == 0) {
        iVar3 = keymatch(pcVar9,"cfile",2);
        if (iVar3 == 0) {
          iVar3 = keymatch(pcVar9,"comment",1);
          if ((iVar3 == 0) || (iVar12 = iVar12 + 1, argc <= iVar12)) goto LAB_00101570;
          lVar13 = (long)iVar12;
          pcVar8 = argv[lVar13];
          if (*pcVar8 == '\"') {
            pcVar9 = (char *)malloc(65000);
            if (pcVar9 == (char *)0x0) goto LAB_0010172a;
            sVar5 = strlen(pcVar8);
            if (sVar5 - 0xfde6 < 0xffffffffffff0218) goto LAB_0010184d;
            strcpy(pcVar9,pcVar8 + 1);
            lVar10 = 0;
            while( true ) {
              sVar5 = strlen(pcVar9);
              if (((int)sVar5 != 0) && (uVar4 = (int)sVar5 - 1, pcVar9[uVar4] == '\"')) break;
              if ((argc + -1) - lVar13 == lVar10) goto LAB_001015b8;
              pcVar8 = argv[lVar13 + lVar10 + 1];
              sVar6 = strlen(pcVar8);
              if ((sVar6 + sVar5) - 0xfde6 < 0xffffffffffff0218) goto LAB_0010184d;
              sVar5 = strlen(pcVar9);
              (pcVar9 + sVar5)[0] = ' ';
              (pcVar9 + sVar5)[1] = '\0';
              strcat(pcVar9,pcVar8);
              lVar10 = lVar10 + 1;
            }
            iVar12 = iVar12 + (int)lVar10;
            pcVar9[uVar4] = '\0';
            pcVar8 = pcVar9;
          }
          else {
            sVar5 = strlen(pcVar8);
            if (64999 < sVar5) goto LAB_0010184d;
          }
          sVar5 = strlen(pcVar8);
          local_68 = iVar12;
        }
        else {
          iVar12 = iVar12 + 1;
          if (argc <= iVar12) goto LAB_00101570;
          lVar13 = (long)iVar12;
          __stream = fopen(argv[lVar13],"r");
          local_68 = iVar12;
          if (__stream == (FILE *)0x0) goto LAB_00101548;
        }
      }
      else {
        bVar2 = false;
        local_68 = iVar12;
      }
      iVar11 = (int)sVar5;
      iVar12 = local_68 + 1;
      bVar1 = iVar12 < argc;
    } while ((iVar12 < argc) && (pcVar9 = argv[iVar12], *pcVar9 == '-'));
    local_68._0_1_ = !bVar2;
  }
  if (((pcVar8 == (char *)0x0) || (__stream == (FILE *)0x0)) &&
     ((bool)((pcVar8 != (char *)0x0 || __stream != (FILE *)0x0) | bVar1))) {
    if (!bVar1) goto LAB_00101575;
    lVar13 = (long)iVar12;
    infile = (FILE *)fopen(argv[lVar13],"rb");
    if ((FILE *)infile == (FILE *)0x0) {
LAB_00101548:
      fprintf(_stderr,"%s: can\'t open %s\n",progname,argv[lVar13]);
      goto LAB_0010186a;
    }
  }
  else {
LAB_00101570:
    usage();
LAB_00101575:
    infile = (FILE *)_stdin;
  }
  if (iVar12 < argc + -1) {
    fprintf(_stderr,"%s: only one input file\n",progname);
    usage();
LAB_001015b8:
    pcVar9 = "Missing ending quote mark";
  }
  else {
    outfile = _stdout;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)malloc(65000);
      if (pcVar8 == (char *)0x0) {
LAB_0010172a:
        pcVar9 = "Insufficient memory";
        goto LAB_0010175c;
      }
      __stream_00 = __stream;
      if (__stream == (FILE *)0x0) {
        __stream_00 = _stdin;
      }
      iVar12 = getc(__stream_00);
      lVar13 = 0;
      if (iVar12 != -1) {
        lVar13 = 0;
        do {
          if (lVar13 == 65000) goto LAB_0010184d;
          pcVar8[lVar13] = (char)iVar12;
          lVar13 = lVar13 + 1;
          iVar12 = getc(__stream_00);
        } while (iVar12 != -1);
      }
      iVar11 = (int)lVar13;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
    }
    iVar12 = getc((FILE *)infile);
    iVar3 = getc((FILE *)infile);
    if ((iVar12 == 0xff) && (iVar3 == 0xd8)) {
      putc(0xff,(FILE *)outfile);
      putc(0xd8,(FILE *)outfile);
LAB_0010164f:
      while( true ) {
        iVar3 = read_1_byte();
        iVar12 = iVar3;
        while (iVar12 != 0xff) {
          iVar12 = read_1_byte();
        }
        do {
          iVar12 = read_1_byte();
        } while (iVar12 == 0xff);
        if (iVar3 != 0xff) {
          fwrite("Warning: garbage data found in JPEG file\n",0x29,1,_stderr);
        }
        uVar7 = (ulong)(iVar12 - 0xc0U);
        if (iVar12 - 0xc0U < 0x3f) break;
LAB_001016cd:
        putc(0xff,(FILE *)outfile);
        putc(iVar12,(FILE *)outfile);
        copy_variable();
      }
      if (uVar7 == 0x3e) {
        iVar12 = 0xfe;
        if ((char)local_68 == '\0') goto LAB_001016cd;
        uVar4 = read_2_bytes();
        if (uVar4 < 2) {
          pcVar9 = "Erroneous JPEG marker length";
          goto LAB_0010175c;
        }
        for (iVar12 = uVar4 - 2; iVar12 != 0; iVar12 = iVar12 + -1) {
          read_1_byte();
        }
        goto LAB_0010164f;
      }
      if ((0x200eeefUL >> (uVar7 & 0x3f) & 1) != 0) {
        if (iVar11 != 0) {
          putc(0xff,(FILE *)outfile);
          putc(0xfe,(FILE *)outfile);
          putc(iVar11 + 2U >> 8 & 0xff,(FILE *)outfile);
          putc(iVar11 + 2U & 0xff,(FILE *)outfile);
          lVar13 = 0;
          do {
            putc((int)pcVar8[lVar13],(FILE *)outfile);
            lVar13 = lVar13 + 1;
          } while (iVar11 != (int)lVar13);
        }
        write_marker(iVar12);
        copy_rest_of_file();
        exit(0);
      }
      if (uVar7 != 0x1a) goto LAB_001016cd;
      pcVar9 = "SOS without prior SOFn";
    }
    else {
      pcVar9 = "Not a JPEG file";
    }
  }
LAB_0010175c:
  fprintf(_stderr,"%s\n",pcVar9);
LAB_0010186a:
  exit(1);
LAB_0010184d:
  fprintf(_stderr,"Comment text may not exceed %u bytes\n",65000);
  goto LAB_0010186a;
}

Assistant:

int
main(int argc, char **argv)
{
  int argn;
  char *arg;
  int keep_COM = 1;
  char *comment_arg = NULL;
  FILE *comment_file = NULL;
  unsigned int comment_length = 0;
  int marker;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "wrjpgcom";      /* in case C library doesn't provide it */

  /* Parse switches, if any */
  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (arg[0] != '-')
      break;                    /* not switch, must be file name */
    arg++;                      /* advance over '-' */
    if (keymatch(arg, "replace", 1)) {
      keep_COM = 0;
    } else if (keymatch(arg, "cfile", 2)) {
      if (++argn >= argc) usage();
      if ((comment_file = fopen(argv[argn], "r")) == NULL) {
        fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
    } else if (keymatch(arg, "comment", 1)) {
      if (++argn >= argc) usage();
      comment_arg = argv[argn];
      /* If the comment text starts with '"', then we are probably running
       * under MS-DOG and must parse out the quoted string ourselves.  Sigh.
       */
      if (comment_arg[0] == '"') {
        comment_arg = (char *)malloc((size_t)MAX_COM_LENGTH);
        if (comment_arg == NULL)
          ERREXIT("Insufficient memory");
        if (strlen(argv[argn]) + 2 >= (size_t)MAX_COM_LENGTH) {
          fprintf(stderr, "Comment text may not exceed %u bytes\n",
                  (unsigned int)MAX_COM_LENGTH);
          exit(EXIT_FAILURE);
        }
        strcpy(comment_arg, argv[argn] + 1);
        for (;;) {
          comment_length = (unsigned int)strlen(comment_arg);
          if (comment_length > 0 && comment_arg[comment_length - 1] == '"') {
            comment_arg[comment_length - 1] = '\0'; /* zap terminating quote */
            break;
          }
          if (++argn >= argc)
            ERREXIT("Missing ending quote mark");
          if (strlen(comment_arg) + strlen(argv[argn]) + 2 >=
              (size_t)MAX_COM_LENGTH) {
            fprintf(stderr, "Comment text may not exceed %u bytes\n",
                    (unsigned int)MAX_COM_LENGTH);
            exit(EXIT_FAILURE);
          }
          strcat(comment_arg, " ");
          strcat(comment_arg, argv[argn]);
        }
      } else if (strlen(argv[argn]) >= (size_t)MAX_COM_LENGTH) {
        fprintf(stderr, "Comment text may not exceed %u bytes\n",
                (unsigned int)MAX_COM_LENGTH);
        exit(EXIT_FAILURE);
      }
      comment_length = (unsigned int)strlen(comment_arg);
    } else
      usage();
  }

  /* Cannot use both -comment and -cfile. */
  if (comment_arg != NULL && comment_file != NULL)
    usage();
  /* If there is neither -comment nor -cfile, we will read the comment text
   * from stdin; in this case there MUST be an input JPEG file name.
   */
  if (comment_arg == NULL && comment_file == NULL && argn >= argc)
    usage();

  /* Open the input file. */
  if (argn < argc) {
    if ((infile = fopen(argv[argn], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
#ifdef USE_SETMODE              /* need to hack file mode? */
    setmode(fileno(stdin), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
    if ((infile = fdopen(fileno(stdin), READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open stdin\n", progname);
      exit(EXIT_FAILURE);
    }
#else
    infile = stdin;
#endif
  }

  /* Open the output file. */
#ifdef TWO_FILE_COMMANDLINE
  /* Must have explicit output file name */
  if (argn != argc - 2) {
    fprintf(stderr, "%s: must name one input and one output file\n", progname);
    usage();
  }
  if ((outfile = fopen(argv[argn + 1], WRITE_BINARY)) == NULL) {
    fprintf(stderr, "%s: can't open %s\n", progname, argv[argn + 1]);
    exit(EXIT_FAILURE);
  }
#else
  /* Unix style: expect zero or one file name */
  if (argn < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
  /* default output file is stdout */
#ifdef USE_SETMODE              /* need to hack file mode? */
  setmode(fileno(stdout), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
  if ((outfile = fdopen(fileno(stdout), WRITE_BINARY)) == NULL) {
    fprintf(stderr, "%s: can't open stdout\n", progname);
    exit(EXIT_FAILURE);
  }
#else
  outfile = stdout;
#endif
#endif /* TWO_FILE_COMMANDLINE */

  /* Collect comment text from comment_file or stdin, if necessary */
  if (comment_arg == NULL) {
    FILE *src_file;
    int c;

    comment_arg = (char *)malloc((size_t)MAX_COM_LENGTH);
    if (comment_arg == NULL)
      ERREXIT("Insufficient memory");
    comment_length = 0;
    src_file = (comment_file != NULL ? comment_file : stdin);
    while ((c = getc(src_file)) != EOF) {
      if (comment_length >= (unsigned int)MAX_COM_LENGTH) {
        fprintf(stderr, "Comment text may not exceed %u bytes\n",
                (unsigned int)MAX_COM_LENGTH);
        exit(EXIT_FAILURE);
      }
      comment_arg[comment_length++] = (char)c;
    }
    if (comment_file != NULL)
      fclose(comment_file);
  }

  /* Copy JPEG headers until SOFn marker;
   * we will insert the new comment marker just before SOFn.
   * This (a) causes the new comment to appear after, rather than before,
   * existing comments; and (b) ensures that comments come after any JFIF
   * or JFXX markers, as required by the JFIF specification.
   */
  marker = scan_JPEG_header(keep_COM);
  /* Insert the new COM marker, but only if nonempty text has been supplied */
  if (comment_length > 0) {
    write_marker(M_COM);
    write_2_bytes(comment_length + 2);
    while (comment_length > 0) {
      write_1_byte(*comment_arg++);
      comment_length--;
    }
  }
  /* Duplicate the remainder of the source file.
   * Note that any COM markers occurring after SOF will not be touched.
   */
  write_marker(marker);
  copy_rest_of_file();

  /* All done. */
  exit(EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}